

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::tryToOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this,
          Expression *oneSide,Expression *otherSide)

{
  Store *pSVar1;
  ulong uVar2;
  Literal local_38;
  
  if (oneSide->_id == ConstId) {
    Literal::Literal(&local_38,(Literal *)(oneSide + 1));
    uVar2 = Literal::getInteger(&local_38);
    if ((uVar2 < 0x400) && (uVar2 = uVar2 + (this->curr->offset).addr, uVar2 < 0x400)) {
      Literal::~Literal(&local_38);
      pSVar1 = this->curr;
      (pSVar1->offset).addr = uVar2;
      pSVar1->ptr = otherSide;
      if (otherSide->_id != ConstId) {
        return true;
      }
      optimizeConstantPointer(this);
      return true;
    }
    Literal::~Literal(&local_38);
  }
  return false;
}

Assistant:

bool tryToOptimizeConstant(Expression* oneSide, Expression* otherSide) {
    if (auto* c = oneSide->dynCast<Const>()) {
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        curr->offset = result.total;
        curr->ptr = otherSide;
        if (curr->ptr->template is<Const>()) {
          optimizeConstantPointer();
        }
        return true;
      }
    }
    return false;
  }